

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_node_implicit_sampling
               (V *values,int num_keys,int sample_num_keys,int sample_data_capacity,int step_size,
               StatAccumulator *ent,LinearModel<int> *sample_model)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long *in_R9;
  LinearModel<int> *in_stack_00000008;
  int j;
  int positions_remaining;
  int actual_position;
  int predicted_position;
  int i;
  int sample_keys_remaining;
  int last_position;
  int local_58;
  int local_54 [3];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38 [3];
  int local_2c;
  int local_28;
  int local_24;
  long *local_20;
  int local_18;
  int local_14;
  int local_c;
  long local_8;
  
  local_24 = -1;
  local_2c = 0;
  local_28 = in_EDX;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while( true ) {
    if (local_c <= local_2c) {
      return;
    }
    local_38[1] = 0;
    local_38[0] = local_14 + -1;
    local_3c = LinearModel<int>::predict(in_stack_00000008,*(int *)(local_8 + (long)local_2c * 8));
    piVar1 = std::min<int>(local_38,&local_3c);
    piVar1 = std::max<int>(local_38 + 1,piVar1);
    local_38[2] = *piVar1;
    local_44 = local_24 + 1;
    piVar1 = std::max<int>(local_38 + 2,&local_44);
    local_40 = *piVar1;
    local_48 = local_14 - local_40;
    if (local_48 < local_28) break;
    (**(code **)(*local_20 + 0x10))(local_20,local_40,local_38[2]);
    local_24 = local_40;
    local_28 = local_28 + -1;
    local_2c = local_18 + local_2c;
  }
  local_40 = local_14 - local_28;
  for (local_54[2] = local_2c; local_54[2] < local_c; local_54[2] = local_18 + local_54[2]) {
    local_54[1] = 0;
    local_54[0] = local_14 + -1;
    local_58 = LinearModel<int>::predict
                         (in_stack_00000008,*(int *)(local_8 + (long)local_54[2] * 8));
    piVar1 = std::min<int>(local_54,&local_58);
    piVar1 = std::max<int>(local_54 + 1,piVar1);
    local_38[2] = *piVar1;
    (**(code **)(*local_20 + 0x10))(local_20,local_40,local_38[2]);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void build_node_implicit_sampling(const V* values, int num_keys,
                                           int sample_num_keys,
                                           int sample_data_capacity,
                                           int step_size, StatAccumulator* ent,
                                           const LinearModel<T>* sample_model) {
    int last_position = -1;
    int sample_keys_remaining = sample_num_keys;
    for (int i = 0; i < num_keys; i += step_size) {
      int predicted_position =
          std::max(0, std::min(sample_data_capacity - 1,
                               sample_model->predict(values[i].first)));
      int actual_position =
          std::max<int>(predicted_position, last_position + 1);
      int positions_remaining = sample_data_capacity - actual_position;
      if (positions_remaining < sample_keys_remaining) {
        actual_position = sample_data_capacity - sample_keys_remaining;
        for (int j = i; j < num_keys; j += step_size) {
          predicted_position =
              std::max(0, std::min(sample_data_capacity - 1,
                                   sample_model->predict(values[j].first)));
          ent->accumulate(actual_position, predicted_position);
          actual_position++;
        }
        break;
      }
      ent->accumulate(actual_position, predicted_position);
      last_position = actual_position;
      sample_keys_remaining--;
    }
  }